

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bracket_notation_parser_impl.h
# Opt level: O0

Node<label::JSONLabel> * __thiscall
parser::BracketNotationParser<label::JSONLabel>::parse_single
          (Node<label::JSONLabel> *__return_storage_ptr__,
          BracketNotationParser<label::JSONLabel> *this,string *tree_string)

{
  __type _Var1;
  bool bVar2;
  reference pbVar3;
  reference this_00;
  Node<label::JSONLabel> *pNVar4;
  Node<label::JSONLabel> local_168;
  value_type local_128;
  undefined1 local_120 [8];
  Node<label::JSONLabel> n;
  JSONLabel node_label;
  reference_wrapper<node::Node<label::JSONLabel>_> rStack_b0;
  bool consumed_token;
  undefined1 local_a1;
  undefined1 local_a0 [8];
  JSONLabel root_label;
  undefined1 local_68 [8];
  string match_str;
  iterator tokens_end;
  iterator tokens_begin;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string *tree_string_local;
  BracketNotationParser<label::JSONLabel> *this_local;
  Node<label::JSONLabel> *root;
  
  get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&tokens_begin,this,tree_string);
  tokens_end = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&tokens_begin);
  match_str.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&tokens_begin);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(&tokens_end);
  pbVar3 = __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&tokens_end);
  std::__cxx11::string::string((string *)local_68,(string *)pbVar3);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68,&this->kLeftBracket);
  if ((_Var1) ||
     (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68,&this->kRightBracket), _Var1)) {
    std::__cxx11::string::operator=((string *)local_68,"");
  }
  else {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&tokens_end);
  }
  label::JSONLabel::JSONLabel((JSONLabel *)local_a0,(string *)local_68);
  local_a1 = 0;
  node::Node<label::JSONLabel>::Node(__return_storage_ptr__,(ConstReference)local_a0);
  rStack_b0 = std::ref<node::Node<label::JSONLabel>>(__return_storage_ptr__);
  std::
  vector<std::reference_wrapper<node::Node<label::JSONLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>_>_>_>
  ::push_back(&this->node_stack,&stack0xffffffffffffff50);
  while (bVar2 = __gnu_cxx::operator!=
                           (&tokens_end,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)&match_str.field_2 + 8)), bVar2) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&tokens_end);
    std::__cxx11::string::operator=((string *)local_68,(string *)pbVar3);
    bVar2 = false;
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,&this->kLeftBracket);
    if (_Var1) {
      bVar2 = true;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&tokens_end);
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&tokens_end);
      std::__cxx11::string::operator=((string *)local_68,(string *)pbVar3);
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68,&this->kLeftBracket);
      if ((_Var1) ||
         (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_68,&this->kRightBracket), _Var1)) {
        std::__cxx11::string::operator=((string *)local_68,"");
      }
      else {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&tokens_end);
      }
      label::JSONLabel::JSONLabel((JSONLabel *)&n.label_.type_,(string *)local_68);
      node::Node<label::JSONLabel>::Node
                ((Node<label::JSONLabel> *)local_120,(ConstReference)&n.label_.type_);
      this_00 = std::
                vector<std::reference_wrapper<node::Node<label::JSONLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>_>_>_>
                ::back(&this->node_stack);
      pNVar4 = std::reference_wrapper<node::Node<label::JSONLabel>_>::get(this_00);
      node::Node<label::JSONLabel>::Node(&local_168,(Node<label::JSONLabel> *)local_120);
      pNVar4 = node::Node<label::JSONLabel>::add_child(pNVar4,&local_168);
      local_128._M_data = (Node<label::JSONLabel> *)std::ref<node::Node<label::JSONLabel>>(pNVar4);
      std::
      vector<std::reference_wrapper<node::Node<label::JSONLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>_>_>_>
      ::push_back(&this->node_stack,&local_128);
      node::Node<label::JSONLabel>::~Node(&local_168);
      node::Node<label::JSONLabel>::~Node((Node<label::JSONLabel> *)local_120);
      label::JSONLabel::~JSONLabel((JSONLabel *)&n.label_.type_);
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,&this->kRightBracket);
    if (_Var1) {
      bVar2 = true;
      std::
      vector<std::reference_wrapper<node::Node<label::JSONLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>_>_>_>
      ::pop_back(&this->node_stack);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&tokens_end);
    }
    if (!bVar2) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&tokens_end);
    }
  }
  local_a1 = 1;
  label::JSONLabel::~JSONLabel((JSONLabel *)local_a0);
  std::__cxx11::string::~string((string *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tokens_begin);
  return __return_storage_ptr__;
}

Assistant:

node::Node<Label> BracketNotationParser<Label>::parse_single(
    const std::string& tree_string) {

  std::vector<std::string> tokens = get_tokens(tree_string);

  // Tokenize the input string - get iterator over tokens.
  auto tokens_begin = tokens.begin();
  auto tokens_end = tokens.end();

  // Deal with the root node separately.
  ++tokens_begin; // Advance tokens to label.
  std::string match_str = *tokens_begin;
  if (match_str == kLeftBracket || match_str == kRightBracket) { // Root has an empty label.
    match_str = "";
    // Do not advance tokens - we're already at kLeftBracket or kRightBracket.
  } else { // Non-empty label.
    ++tokens_begin; // Advance tokens.
  }
  Label root_label(match_str);
  node::Node<Label> root(root_label);
  node_stack.push_back(std::ref(root));

  bool consumed_token = false;

  // Iterate all remaining tokens.
  while (tokens_begin != tokens_end) {
    match_str = *tokens_begin;
    consumed_token = false;

    if (match_str == kLeftBracket) { // Enter node.
      consumed_token = true;
      ++tokens_begin; // Advance tokens to label.
      match_str = *tokens_begin;

      if (match_str == kLeftBracket || match_str == kRightBracket) { // Node has an empty label.
        match_str = "";
        // Do not advance tokens - we're already at kLeftBracket or kRightBracket.
      } else { // Non-empty label.
        ++tokens_begin; // Advance tokens.
      }

      // Create new node.
      Label node_label(match_str);
      node::Node<Label> n(node_label);

      // Move n to become a child.
      // Return reference from add_child to the 'new-located' object.
      // Put a reference to just-moved n (last child of its parent) on a stack.
      node_stack.push_back(std::ref(node_stack.back().get().add_child(n)));
    }

    if (match_str == kRightBracket) { // Exit node.
      consumed_token = true;
      node_stack.pop_back();
      ++tokens_begin; // Advance tokens.
    }

    // Skip incorrect token.
    if (consumed_token == false) {
      ++tokens_begin; // Advance tokens.
    }
  }
  return root;
}